

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv_resident_set_memory(size_t *rss)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  char buf [1024];
  char acStack_428 [1032];
  
  while (iVar1 = open("/proc/self/stat",0), iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      return -*piVar2;
    }
  }
  while (sVar3 = read(iVar1,acStack_428,0x3ff), sVar3 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      uv__close(iVar1);
      return -*piVar2;
    }
  }
  uv__close(iVar1);
  acStack_428[sVar3] = '\0';
  pcVar4 = strchr(acStack_428,0x20);
  iVar1 = -0x16;
  if (pcVar4 == (char *)0x0) {
    return -0x16;
  }
  if (pcVar4[1] == '(') {
    pcVar4 = strchr(pcVar4 + 1,0x29);
    if (pcVar4 == (char *)0x0) {
      return -0x16;
    }
    iVar6 = 0x16;
    do {
      pcVar4 = strchr(pcVar4 + 1,0x20);
      if (pcVar4 == (char *)0x0) {
        return -0x16;
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar5 = strtol(pcVar4,(char **)0x0,10);
    if ((*piVar2 == 0) && (-1 < lVar5)) {
      iVar1 = getpagesize();
      *rss = lVar5 * iVar1;
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x16;
}

Assistant:

int uv_resident_set_memory(size_t* rss) {
  char buf[1024];
  const char* s;
  ssize_t n;
  long val;
  int fd;
  int i;

  do
    fd = open("/proc/self/stat", O_RDONLY);
  while (fd == -1 && errno == EINTR);

  if (fd == -1)
    return UV__ERR(errno);

  do
    n = read(fd, buf, sizeof(buf) - 1);
  while (n == -1 && errno == EINTR);

  uv__close(fd);
  if (n == -1)
    return UV__ERR(errno);
  buf[n] = '\0';

  s = strchr(buf, ' ');
  if (s == NULL)
    goto err;

  s += 1;
  if (*s != '(')
    goto err;

  s = strchr(s, ')');
  if (s == NULL)
    goto err;

  for (i = 1; i <= 22; i++) {
    s = strchr(s + 1, ' ');
    if (s == NULL)
      goto err;
  }

  errno = 0;
  val = strtol(s, NULL, 10);
  if (errno != 0)
    goto err;
  if (val < 0)
    goto err;

  *rss = val * getpagesize();
  return 0;

err:
  return UV_EINVAL;
}